

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O0

void __thiscall CircBufTest::CircBufTest(CircBufTest *this,int test_id)

{
  char local_48 [8];
  char name [32];
  int test_id_local;
  CircBufTest *this_local;
  
  TestCase::TestCase(&this->super_TestCase,"CircBuf");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR__CircBufTest_0010cc80;
  this->mTest = test_id;
  JetHead::CircularBuffer::CircularBuffer(&this->gbuff,0x80);
  Condition::Condition(&this->gbuff_cond);
  Mutex::Mutex(&this->gbuff_mutex,false);
  sprintf(local_48,"Circular Buffer Test %d",(ulong)(uint)test_id);
  TestCase::SetTestName(&this->super_TestCase,local_48);
  return;
}

Assistant:

CircBufTest::CircBufTest(int test_id)
		: TestCase("CircBuf"), mTest(test_id), gbuff(BUFFER_SIZE)
{

	char name[32];

	sprintf( name, "Circular Buffer Test %d", test_id);

	SetTestName( name );

}